

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O3

void __thiscall MusInfo::Start(MusInfo *this,bool loop,float rel_vol,int subsong)

{
  if (nomusic == 0) {
    if (0.0 < rel_vol) {
      relative_volume = rel_vol;
      saved_relative_volume = rel_vol;
    }
    (*this->_vptr_MusInfo[7])(this);
    (*this->_vptr_MusInfo[4])(this,loop,(ulong)(uint)subsong);
    this->m_NotStartedYet = false;
    currSong = (MusInfo *)0x0;
    if (this->m_Status == STATE_Playing) {
      currSong = this;
    }
    if (snd_musicvolume.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
      (*snd_musicvolume.super_FBaseCVar.m_Callback)(&snd_musicvolume.super_FBaseCVar);
      return;
    }
  }
  return;
}

Assistant:

void MusInfo::Start(bool loop, float rel_vol, int subsong)
{
	if (nomusic) return;

	if (rel_vol > 0.f) saved_relative_volume = relative_volume = rel_vol;
	Stop ();
	Play (loop, subsong);
	m_NotStartedYet = false;
	
	if (m_Status == MusInfo::STATE_Playing)
		currSong = this;
	else
		currSong = NULL;
		
	// Notify the sound system of the changed relative volume
	snd_musicvolume.Callback();
}